

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

void Dau_DsdToTruth_rec(char *pStr,char **p,int *pMatches,word **pTtElems,word *pRes,int nVars)

{
  char cVar1;
  char cVar2;
  uint nWordsR;
  int iVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  word *pwVar10;
  bool bVar11;
  word pFunc [64];
  word pTtTemp [64];
  word local_1a38 [64];
  word local_1838 [64];
  ulong auStack_1638 [64];
  ulong auStack_1438 [641];
  
  nWordsR = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWordsR = 1;
  }
  uVar7 = (ulong)nWordsR;
  cVar1 = **p;
  if (cVar1 == '!') {
    *p = *p + 1;
  }
  pcVar9 = *p;
  cVar2 = *pcVar9;
  if ((byte)(cVar2 + 0x9fU) < 0x1a) {
    if (nVars <= (int)((int)cVar2 - 0x61U)) {
      __assert_fail("**p - \'a\' >= 0 && **p - \'a\' < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x21f,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    pwVar10 = pTtElems[(int)cVar2 - 0x61U];
    if (cVar1 == '!') {
      if (0 < (int)nWordsR) {
        uVar6 = 0;
        do {
          pRes[uVar6] = ~pwVar10[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
    }
    else if (0 < (int)nWordsR) {
      uVar6 = 0;
      do {
        pRes[uVar6] = pwVar10[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
  }
  else if (cVar2 == '[') {
    iVar3 = pMatches[(long)pcVar9 - (long)pStr];
    if (pStr[iVar3] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x236,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (0 < (int)nWordsR) {
      memset(pRes,0,uVar7 << 3);
    }
    pcVar9 = *p + 1;
    *p = pcVar9;
    while (pcVar9 < pStr + iVar3) {
      Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,local_1838,nVars);
      if (0 < (int)nWordsR) {
        uVar6 = 0;
        do {
          pRes[uVar6] = pRes[uVar6] ^ local_1838[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      pcVar9 = *p + 1;
      *p = pcVar9;
    }
    if (pcVar9 != pStr + iVar3) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x23d,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (cVar1 == '!' && 0 < (int)nWordsR) {
      uVar7 = 0;
      do {
        pRes[uVar7] = ~pRes[uVar7];
        uVar7 = uVar7 + 1;
      } while (nWordsR != uVar7);
    }
  }
  else if (cVar2 == '<') {
    if (pStr[pMatches[(long)pcVar9 - (long)pStr]] != '>') {
      __assert_fail("**p == \'<\' && *q == \'>\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x246,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    pcVar4 = pStr + pMatches[(long)pcVar9 - (long)pStr];
    pcVar9 = pcVar9 + 1;
    *p = pcVar9;
    if (pcVar9 < pcVar4) {
      lVar8 = 0;
      do {
        Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,(word *)((long)local_1838 + lVar8),nVars);
        pcVar9 = *p + 1;
        *p = pcVar9;
        lVar8 = lVar8 + 0x200;
      } while (pcVar9 < pcVar4);
      bVar11 = lVar8 == 0x600;
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      __assert_fail("i == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x249,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (0 < (int)nWordsR) {
      uVar7 = 0;
      do {
        pRes[uVar7] = (auStack_1638[uVar7] ^ auStack_1438[uVar7]) & local_1838[uVar7] ^
                      auStack_1438[uVar7];
        uVar7 = uVar7 + 1;
      } while (nWordsR != uVar7);
    }
    if (pcVar9 != pcVar4) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x24b,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (cVar1 == '!' && 0 < (int)nWordsR) {
      uVar7 = 0;
      do {
        pRes[uVar7] = ~pRes[uVar7];
        uVar7 = uVar7 + 1;
      } while (nWordsR != uVar7);
    }
  }
  else if (cVar2 == '(') {
    if (pStr[pMatches[(long)pcVar9 - (long)pStr]] != ')') {
      __assert_fail("**p == \'(\' && *q == \')\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x227,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    pcVar9 = pStr + pMatches[(long)pcVar9 - (long)pStr];
    if (0 < (int)nWordsR) {
      memset(pRes,0xff,(ulong)nWordsR << 3);
    }
    pcVar4 = *p + 1;
    *p = pcVar4;
    if (pcVar4 < pcVar9) {
      do {
        Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,local_1838,nVars);
        if (0 < (int)nWordsR) {
          uVar6 = 0;
          do {
            pRes[uVar6] = pRes[uVar6] & local_1838[uVar6];
            uVar6 = uVar6 + 1;
          } while (nWordsR != uVar6);
        }
        pcVar4 = *p + 1;
        *p = pcVar4;
      } while (pcVar4 < pcVar9);
    }
    if (pcVar4 != pcVar9) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x22e,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (cVar1 == '!' && 0 < (int)nWordsR) {
      uVar6 = 0;
      do {
        pRes[uVar6] = ~pRes[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
  }
  else {
    if (5 < (byte)(cVar2 + 0xbfU) && 9 < (byte)(cVar2 - 0x30U)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x25f,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    iVar3 = Abc_TtReadHex(local_1a38,pcVar9);
    iVar5 = 1 << ((char)iVar3 - 2U & 0x1f);
    if (iVar3 < 3) {
      iVar5 = 1;
    }
    pcVar4 = *p;
    pcVar9 = pcVar4 + iVar5;
    *p = pcVar9;
    if ((pcVar4[iVar5] != '{') ||
       (pcVar4 = pStr + pMatches[(long)pcVar9 - (long)pStr], *pcVar4 != '}')) {
      __assert_fail("**p == \'{\' && *q == \'}\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x256,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    pcVar9 = pcVar9 + 1;
    *p = pcVar9;
    iVar5 = 0;
    if (pcVar9 < pcVar4) {
      pwVar10 = local_1838;
      iVar5 = 0;
      do {
        Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,pwVar10,nVars);
        pcVar9 = *p + 1;
        *p = pcVar9;
        pwVar10 = pwVar10 + 0x40;
        iVar5 = iVar5 + 1;
      } while (pcVar9 < pcVar4);
    }
    if (iVar5 != iVar3) {
      __assert_fail("i == nVarsF",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x259,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (pcVar9 != pcVar4) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x25a,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    Dau_DsdTruthCompose_rec(local_1a38,&local_1838,pRes,iVar3,nWordsR);
    if (0 < (int)nWordsR && cVar1 == '!') {
      uVar7 = 0;
      do {
        pRes[uVar7] = ~pRes[uVar7];
        uVar7 = uVar7 + 1;
      } while (nWordsR != uVar7);
    }
  }
  return;
}

Assistant:

void Dau_DsdToTruth_rec( char * pStr, char ** p, int * pMatches, word ** pTtElems, word * pRes, int nVars )
{
    int nWords = Abc_TtWordNum( nVars );
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        assert( **p - 'a' >= 0 && **p - 'a' < nVars );
        Abc_TtCopy( pRes, pTtElems[**p - 'a'], nWords, fCompl );
        return;
    }
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[DAU_MAX_WORD];
        assert( **p == '(' && *q == ')' );
        Abc_TtConst1( pRes, nWords );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp, nVars );
            Abc_TtAnd( pRes, pRes, pTtTemp, nWords, 0 );
        }
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[DAU_MAX_WORD];
        assert( **p == '[' && *q == ']' );
        Abc_TtConst0( pRes, nWords );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp, nVars );
            Abc_TtXor( pRes, pRes, pTtTemp, nWords, 0 );
        }
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( **p == '<' ) // mux
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[3][DAU_MAX_WORD];
        int i;
        assert( **p == '<' && *q == '>' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp[i], nVars );
        assert( i == 3 );
        Abc_TtMux( pRes, pTtTemp[0], pTtTemp[1], pTtTemp[2], nWords );
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], pFunc[DAU_MAX_WORD];
        char * q;
        int i, nVarsF = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVarsF );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pFanins[i], nVars );
        assert( i == nVarsF );
        assert( *p == q );
        Dau_DsdTruthCompose_rec( pFunc, pFanins, pRes, nVarsF, nWords );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    assert( 0 );
}